

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_constraints_unittest.cc
# Opt level: O0

void __thiscall
bssl::ParseNameConstraints_IsPermittedCertSubjectEmailAddressIsOk_Test::
~ParseNameConstraints_IsPermittedCertSubjectEmailAddressIsOk_Test
          (ParseNameConstraints_IsPermittedCertSubjectEmailAddressIsOk_Test *this)

{
  ParseNameConstraints_IsPermittedCertSubjectEmailAddressIsOk_Test *this_local;
  
  ~ParseNameConstraints_IsPermittedCertSubjectEmailAddressIsOk_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_P(ParseNameConstraints, IsPermittedCertSubjectEmailAddressIsOk) {
  std::string constraints_der;
  ASSERT_TRUE(LoadTestNameConstraint("rfc822name-permitted-hostname.pem",
                                     &constraints_der));
  CertErrors errors;
  std::unique_ptr<NameConstraints> name_constraints(NameConstraints::Create(
      StringAsBytes(constraints_der), is_critical(), &errors));
  ASSERT_TRUE(name_constraints);

  std::string name;
  ASSERT_TRUE(LoadTestName("name-us-arizona-email.pem", &name));

  // Name constraints contain rfc822Name, and the address matches the
  // constraint (which is all addresses on the hostname.)
  EXPECT_TRUE(IsPermittedCert(name_constraints.get(),
                              SequenceValueFromString(name),
                              /*subject_alt_names=*/nullptr));

  ASSERT_TRUE(LoadTestName("name-us-arizona-email-invalidstring.pem", &name));
  // The bytes of the name string match, but the string type is VISIBLESTRING
  // which is not supported, so this should fail.
  EXPECT_FALSE(IsPermittedCert(name_constraints.get(),
                               SequenceValueFromString(name),
                               /*subject_alt_names=*/nullptr));

  ASSERT_TRUE(LoadTestName("name-us-arizona-email-multiple.pem", &name));
  // Subject contains multiple rfc822Names, and they all match the constraint
  // (which is all addresses on the hostname.)
  EXPECT_TRUE(IsPermittedCert(name_constraints.get(),
                              SequenceValueFromString(name),
                              /*subject_alt_names=*/nullptr));
}